

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  uint *puVar1;
  ReflectionSchema *this_00;
  uint uVar2;
  OneofDescriptor *oneof_descriptor;
  long lVar3;
  long *plVar4;
  uint32 uVar5;
  int iVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  undefined8 *puVar9;
  Message *pMVar10;
  long *plVar11;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_40);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    pMVar7 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),field,factory);
    return (Message *)pMVar7;
  }
  this_00 = &this->schema_;
  uVar5 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
  oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
  if (oneof_descriptor == (OneofDescriptor *)0x0) {
    uVar8 = (ulong)(uint)(this->schema_).has_bits_offset_;
    if (uVar8 != 0xffffffff) {
      if (field[0x42] == (FieldDescriptor)0x0) {
        plVar11 = (long *)(*(long *)(field + 0x50) + 0x28);
      }
      else if (*(long *)(field + 0x60) == 0) {
        plVar11 = (long *)(*(long *)(field + 0x28) + 0x80);
      }
      else {
        plVar11 = (long *)(*(long *)(field + 0x60) + 0x50);
      }
      uVar2 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *plVar11) >> 3) * 0x286bca1b];
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar2 >> 5) * 4 + uVar8);
      *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
    }
  }
  else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                              *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30))
                                      >> 4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
           *(int *)(field + 0x44)) {
    ClearOneof(this,message,oneof_descriptor);
    lVar3 = *(long *)(field + 0x58);
    if (lVar3 == 0) {
      uVar8 = (ulong)(uint)(this->schema_).has_bits_offset_;
      if (uVar8 != 0xffffffff) {
        if (field[0x42] == (FieldDescriptor)0x0) {
          plVar11 = (long *)(*(long *)(field + 0x50) + 0x28);
        }
        else if (*(long *)(field + 0x60) == 0) {
          plVar11 = (long *)(*(long *)(field + 0x28) + 0x80);
        }
        else {
          plVar11 = (long *)(*(long *)(field + 0x60) + 0x50);
        }
        uVar2 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *plVar11) >> 3) * 0x286bca1b];
        puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar2 >> 5) * 4 + uVar8);
        *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      }
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x44);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    plVar11 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
    puVar9 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
    plVar4 = (long *)*puVar9;
    iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    pMVar10 = (Message *)(**(code **)(*plVar4 + 0x20))(plVar4,iVar6);
    *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = pMVar10;
    goto LAB_00284bfc;
  }
  plVar11 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
  pMVar10 = (Message *)*plVar11;
LAB_00284bfc:
  if (pMVar10 == (Message *)0x0) {
    puVar9 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
    plVar4 = (long *)*puVar9;
    iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    pMVar10 = (Message *)(**(code **)(*plVar4 + 0x20))(plVar4,iVar6);
    *plVar11 = (long)pMVar10;
  }
  return pMVar10;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}